

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  byte bVar1;
  char cVar2;
  uint local_34;
  char **badPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr + 2;
  do {
    if (end_local == end + -2) {
      return 1;
    }
    if (*end_local == '\0') {
      local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
    }
    else {
      local_34 = unicode_byte_type(*end_local,end_local[1]);
    }
    if ((1 < local_34 - 9) && (6 < local_34 - 0xd)) {
      if (local_34 == 0x15) {
        if ((*end_local == '\0') && (end_local[1] == '\t')) {
          *badPtr = end_local;
          return 0;
        }
      }
      else if (local_34 == 0x16) {
LAB_009183a5:
        if (*end_local == '\0') {
          bVar1 = end_local[1];
        }
        else {
          bVar1 = 0xff;
        }
        if ((bVar1 & 0x80) != 0) {
LAB_009183d7:
          if (*end_local == '\0') {
            cVar2 = end_local[1];
          }
          else {
            cVar2 = -1;
          }
          if ((cVar2 != '$') && (cVar2 != '@')) {
            *badPtr = end_local;
            return 0;
          }
        }
      }
      else if (2 < local_34 - 0x17) {
        if (local_34 == 0x1a) goto LAB_009183a5;
        if ((local_34 == 0x1b) || (local_34 - 0x1e < 6)) goto LAB_0091842b;
        goto LAB_009183d7;
      }
    }
LAB_0091842b:
    end_local = end_local + 2;
  } while( true );
}

Assistant:

static
int PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **badPtr)
{
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; ptr != end; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#ifdef XML_NS
    case BT_COLON:
#endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (!(BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}